

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_client.cpp
# Opt level: O2

void __thiscall RPCClient::_DoRead(RPCClient *this,Handle handle,BufferPtr *data,uint32_t len)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(int,_std::vector<cppnet::Any,_std::allocator<cppnet::Any>_>_&)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(int,_std::vector<cppnet::Any,_std::allocator<cppnet::Any>_>_&)>_>_>_>
  *this_00;
  _func_int **pp_Var1;
  bool bVar2;
  int len_00;
  mapped_type *this_01;
  function<void_(int,_std::vector<cppnet::Any,_std::allocator<cppnet::Any>_>_&)> *this_02;
  size_type sVar3;
  int __args;
  int code;
  int type;
  uint32_t need_len;
  string name;
  vector<cppnet::Any,_std::allocator<cppnet::Any>_> vec;
  char recv_buf [8192];
  
  memset(recv_buf,0,0x2000);
  need_len = 0;
  this_00 = &this->_func_call_map;
  while( true ) {
    pp_Var1 = (handle.super___shared_ptr<cppnet::CNSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi._M_pi)->_vptr__Sp_counted_base;
    __args = 4;
    len_00 = (**(code **)(*pp_Var1 + 0x38))(pp_Var1,recv_buf,0x2000,"\r\n\r\n",4,&need_len);
    if (len_00 == 0) {
      return;
    }
    vec.super__Vector_base<cppnet::Any,_std::allocator<cppnet::Any>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    vec.super__Vector_base<cppnet::Any,_std::allocator<cppnet::Any>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    vec.super__Vector_base<cppnet::Any,_std::allocator<cppnet::Any>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    type = 0;
    name._M_dataplus._M_p = (pointer)&name.field_2;
    name._M_string_length = 0;
    name.field_2._M_local_buf[0] = '\0';
    code = 0;
    bVar2 = ParsePackage::ParseType
                      ((this->_parse_package).
                       super___shared_ptr<ParsePackage,_(__gnu_cxx::_Lock_policy)2>._M_ptr,recv_buf,
                       len_00,&type);
    if (!bVar2) break;
    if ((type & 2U) == 0) {
      if ((type & 4U) != 0) {
        bVar2 = ParsePackage::ParseFuncList
                          ((this->_parse_package).
                           super___shared_ptr<ParsePackage,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                           recv_buf + 2,len_00 + -2,&this->_func_map);
        if (!bVar2) {
          sVar3 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(int,_std::vector<cppnet::Any,_std::allocator<cppnet::Any>_>_&)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(int,_std::vector<cppnet::Any,_std::allocator<cppnet::Any>_>_&)>_>_>_>
                  ::count(this_00,&name);
          goto LAB_0010e666;
        }
        sVar3 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(int,_std::vector<cppnet::Any,_std::allocator<cppnet::Any>_>_&)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(int,_std::vector<cppnet::Any,_std::allocator<cppnet::Any>_>_&)>_>_>_>
                ::count(this_00,&name);
        goto LAB_0010e5fc;
      }
    }
    else {
      bVar2 = ParsePackage::ParseFuncRet
                        ((this->_parse_package).
                         super___shared_ptr<ParsePackage,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                         recv_buf + 2,len_00 + -2,&code,&name,&this->_func_map,&vec);
      if (!bVar2) {
        sVar3 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(int,_std::vector<cppnet::Any,_std::allocator<cppnet::Any>_>_&)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(int,_std::vector<cppnet::Any,_std::allocator<cppnet::Any>_>_&)>_>_>_>
                ::count(this_00,&name);
LAB_0010e666:
        if (sVar3 == 0) goto LAB_0010e689;
        this_02 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(int,_std::vector<cppnet::Any,_std::allocator<cppnet::Any>_>_&)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(int,_std::vector<cppnet::Any,_std::allocator<cppnet::Any>_>_&)>_>_>_>
                  ::operator[](this_00,&name);
        goto LAB_0010e67a;
      }
      sVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(int,_std::vector<cppnet::Any,_std::allocator<cppnet::Any>_>_&)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(int,_std::vector<cppnet::Any,_std::allocator<cppnet::Any>_>_&)>_>_>_>
              ::count(this_00,&name);
      if (sVar3 != 0) {
        this_01 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(int,_std::vector<cppnet::Any,_std::allocator<cppnet::Any>_>_&)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(int,_std::vector<cppnet::Any,_std::allocator<cppnet::Any>_>_&)>_>_>_>
                  ::operator[](this_00,&name);
        std::function<void_(int,_std::vector<cppnet::Any,_std::allocator<cppnet::Any>_>_&)>::
        operator()(this_01,code,&vec);
      }
    }
    std::__cxx11::string::~string((string *)&name);
    std::vector<cppnet::Any,_std::allocator<cppnet::Any>_>::~vector(&vec);
  }
  sVar3 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(int,_std::vector<cppnet::Any,_std::allocator<cppnet::Any>_>_&)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(int,_std::vector<cppnet::Any,_std::allocator<cppnet::Any>_>_&)>_>_>_>
          ::count(this_00,&name);
LAB_0010e5fc:
  if (sVar3 == 0) goto LAB_0010e689;
  this_02 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(int,_std::vector<cppnet::Any,_std::allocator<cppnet::Any>_>_&)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(int,_std::vector<cppnet::Any,_std::allocator<cppnet::Any>_>_&)>_>_>_>
            ::operator[](this_00,&name);
  __args = 1;
LAB_0010e67a:
  std::function<void_(int,_std::vector<cppnet::Any,_std::allocator<cppnet::Any>_>_&)>::operator()
            (this_02,__args,&vec);
LAB_0010e689:
  std::__cxx11::string::~string((string *)&name);
  std::vector<cppnet::Any,_std::allocator<cppnet::Any>_>::~vector(&vec);
  return;
}

Assistant:

void RPCClient::_DoRead(cppnet::Handle handle, cppnet::BufferPtr data,
                         uint32_t len) {
    char recv_buf[8192] = { 0 };
    uint32_t get_len = 8192;
    uint32_t need_len = 0;
    uint32_t recv_len = 0;
    for (;;) {
        get_len = data->ReadUntil(recv_buf, 8192, "\r\n\r\n", strlen("\r\n\r\n"), need_len);
        if (get_len == 0) {
            break;
        }
        std::vector<cppnet::Any> vec;
        int type = 0;
        std::string name;
        int code = NO_ERROR;
        if (!_parse_package->ParseType(recv_buf, get_len, type)) {
            if (_func_call_map.count(name)) {
                _func_call_map[name](PARAM_TYPE_ERROR, vec);
            }
            break;
        }
        if (type & FUNCTION_RET) {
            if (!_parse_package->ParseFuncRet(recv_buf + 2, get_len - 2, code, name, _func_map, vec)) {
                if (_func_call_map.count(name)) {
                    _func_call_map[name](PARSE_FUNC_ERROR, vec);
                }
                break;
            }
            if (_func_call_map.count(name)) {
                _func_call_map[name](code, vec);
            }

        } else if (type & FUNCTION_INFO) {
            if (!_parse_package->ParseFuncList(recv_buf + 2, get_len - 2, _func_map)) {
                if (_func_call_map.count(name)) {
                    _func_call_map[name](PARSE_FUNC_ERROR, vec);
                }
                break;

            } else {
                if (_func_call_map.count(name)) {
                    _func_call_map[name](PARAM_TYPE_ERROR, vec);
                }
                break;
            }
        }
    }
}